

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O2

void ntheader(fnhead *fnobj)

{
  ushort uVar1;
  LispPTR LVar2;
  ulong uVar3;
  
  LVar2 = LAddrFromNative(fnobj);
  printf("0x%08x: 0x%08x  stkmin\n",(ulong)LVar2,(ulong)fnobj->stkmin);
  printf("0x%08x: 0x%08x  na\n",(ulong)(LVar2 + 1),(ulong)(uint)(int)fnobj->na);
  printf("0x%08x: 0x%08x  pv\n",(ulong)(LVar2 + 2),(ulong)(uint)(int)fnobj->pv);
  printf("0x%08x: 0x%08x  startpc\n",(ulong)(LVar2 + 3),(ulong)fnobj->startpc);
  printf("0x%08x: 0x%08x  argtype\n",(ulong)(LVar2 + 4),
         (ulong)(*(uint *)&fnobj->field_0x8 >> 0x1c & 3));
  printf("0x%08x: 0x%08x  framename ",(ulong)(LVar2 + 5),
         (ulong)(*(uint *)&fnobj->field_0x8 & 0xfffffff));
  print(*(uint *)&fnobj->field_0x8 & 0xfffffff);
  putchar(10);
  printf("0x%08x: 0x%08x  ntsize\n",(ulong)(LVar2 + 6),(ulong)fnobj->ntsize);
  printf("0x%08x: 0x%08x  nlocals",(ulong)(LVar2 + 7),(ulong)(byte)fnobj->field_0xd);
  printf("  0x%08x  fvaroffset\n",(ulong)(byte)fnobj->field_0xc);
  nt1((LispPTR *)(fnobj + 1),(uint)fnobj->ntsize,"Name Table");
  uVar1 = fnobj->ntsize;
  uVar3 = 4;
  if (uVar1 != 0) {
    uVar3 = (ulong)((uint)uVar1 + (uint)uVar1);
  }
  nt1((LispPTR *)(&fnobj[1].na + uVar3),
      (int)((long)fnobj + ((ulong)(fnobj->startpc & 0xfffffffe) - (long)(&fnobj[1].na + uVar3)) >> 2
           ),"Local args");
  return;
}

Assistant:

void ntheader(struct fnhead *fnobj) {
  LispPTR *localnt1;
  int localntsize;
  LispPTR fnobj_lisp;

  fnobj_lisp = LAddrFromNative((DLword *)fnobj);
  printf("0x%08x: 0x%08x  stkmin\n", fnobj_lisp, fnobj->stkmin);
  printf("0x%08x: 0x%08x  na\n", fnobj_lisp + 1, fnobj->na);
  printf("0x%08x: 0x%08x  pv\n", fnobj_lisp + 2, fnobj->pv);
  printf("0x%08x: 0x%08x  startpc\n", fnobj_lisp + 3, fnobj->startpc);
  printf("0x%08x: 0x%08x  argtype\n", fnobj_lisp + 4, fnobj->argtype);
  printf("0x%08x: 0x%08x  framename ", fnobj_lisp + 5, fnobj->framename);
  print(fnobj->framename);
  putchar('\n');
  printf("0x%08x: 0x%08x  ntsize\n", fnobj_lisp + 6, fnobj->ntsize);
  printf("0x%08x: 0x%08x  nlocals", fnobj_lisp + 7, fnobj->nlocals);
  printf("  0x%08x  fvaroffset\n", fnobj->fvaroffset);

  nt1((LispPTR *)((DLword *)fnobj + FNOVERHEADWORDS), fnobj->ntsize, "Name Table");
  localnt1 =
      (LispPTR *)((DLword *)fnobj + FNOVERHEADWORDS + (fnobj->ntsize ? (2 * fnobj->ntsize) : 4));
  localntsize = ((DLword *)fnobj + (fnobj->startpc >> 1) - (DLword *)localnt1) >> 1;
  nt1(localnt1, localntsize, "Local args");
}